

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int * __thiscall fmt::v11::detail::allocator<int>::allocate(allocator<int> *this,size_t n)

{
  unsigned_long uVar1;
  int *piVar2;
  bad_alloc *this_00;
  ulong in_RSI;
  int *p;
  bool local_11;
  ulong local_10;
  
  local_10 = in_RSI;
  uVar1 = max_value<unsigned_long>();
  local_11 = in_RSI <= uVar1 >> 2;
  ignore_unused<bool,char[1]>(&local_11,(char (*) [1])0x1acb1a);
  piVar2 = (int *)malloc(local_10 << 2);
  if (piVar2 == (int *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return piVar2;
}

Assistant:

T* allocate(size_t n) {
    FMT_ASSERT(n <= max_value<size_t>() / sizeof(T), "");
    T* p = static_cast<T*>(malloc(n * sizeof(T)));
    if (!p) FMT_THROW(std::bad_alloc());
    return p;
  }